

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refmap.c
# Opt level: O2

flatcc_refmap_ref_t flatcc_refmap_insert(flatcc_refmap_t *refmap,void *src,flatcc_refmap_ref_t ref)

{
  flatcc_refmap_item *pfVar1;
  flatcc_refmap_item *pfVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  
  if (src != (void *)0x0) {
    sVar6 = refmap->buckets;
    if (sVar6 * 0xb3 >> 8 <= refmap->count) {
      flatcc_refmap_resize(refmap,refmap->count * 2);
      sVar6 = refmap->buckets;
    }
    pfVar2 = refmap->table;
    uVar4 = _flatcc_refmap_hash(src);
    do {
      uVar5 = uVar4 & sVar6 - 1;
      pfVar1 = pfVar2 + uVar5;
      pvVar3 = pfVar2[uVar5].src;
      if (pvVar3 == (void *)0x0) {
        refmap->count = refmap->count + 1;
        pfVar1->src = src;
        break;
      }
      uVar4 = uVar4 + 1;
    } while (pvVar3 != src);
    pfVar1->ref = ref;
  }
  return ref;
}

Assistant:

flatcc_refmap_ref_t flatcc_refmap_insert(flatcc_refmap_t *refmap, const void *src, flatcc_refmap_ref_t ref)
{
    struct flatcc_refmap_item *T;
    size_t N, i, j, k;

    if (src == 0) return ref;
    if (_flatcc_refmap_above_load_factor(refmap->count, refmap->buckets)) {
        if (flatcc_refmap_resize(refmap, refmap->count * 2)) {
            return flatcc_refmap_not_found; /* alloc failed */
        }
    }
    T = refmap->table;
    N = refmap->buckets - 1;
    k = _flatcc_refmap_hash(src);
    i = 0;
    j = _flatcc_refmap_probe(k, i, N);
    while (T[j].src) {
        if (T[j].src == src) {
            return T[j].ref = ref;
        }
        ++i;
        j = _flatcc_refmap_probe(k, i, N);
    }
    ++refmap->count;
    T[j].src = src;
    return T[j].ref = ref;
}